

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O0

bool chapter2::calc_elems(vector<int,_std::allocator<int>_> *ivec,int pos)

{
  ostream *this;
  void *this_00;
  size_type sVar1;
  int pos_local;
  vector<int,_std::allocator<int>_> *ivec_local;
  
  if ((pos < 0) || (0x40 < pos)) {
    this = std::operator<<((ostream *)&std::cerr,"Sorry, invalid position.");
    this_00 = (void *)std::ostream::operator<<(this,pos);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    ivec_local._7_1_ = false;
  }
  else {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(ivec);
    if (sVar1 < (ulong)(long)pos) {
      really_calc_elems(ivec,pos);
    }
    ivec_local._7_1_ = true;
  }
  return ivec_local._7_1_;
}

Assistant:

bool calc_elems(vector<int> &ivec, int pos) {
        if (pos < 0 || pos > 64) {
            cerr << "Sorry, invalid position." << pos << endl;
            return false;
        }

        if (ivec.size() < pos) {
            really_calc_elems(ivec, pos);
        }
        return true;
    }